

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

bool __thiscall
MADPComponentDiscreteActions::SetInitialized(MADPComponentDiscreteActions *this,bool b)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  size_t *psVar4;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *pmVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  ulong uVar8;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    if ((this->_m_initialized != false) && (this->_m_actionStepSize != (size_t *)0x0)) {
      operator_delete__(this->_m_actionStepSize);
    }
  }
  else {
    if ((this->_m_initialized != false) && (this->_m_actionStepSize != (size_t *)0x0)) {
      operator_delete__(this->_m_actionStepSize);
    }
    psVar4 = IndexTools::CalculateStepSize(&this->_m_nrActions);
    this->_m_actionStepSize = psVar4;
    if (this->_m_cachedAllJointActions == false) {
      puVar2 = (this->_m_nrActions).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->_m_nrActions).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar7 = 1;
      for (uVar6 = 0; (long)puVar3 - (long)puVar2 >> 3 != (ulong)uVar6; uVar6 = uVar6 + 1) {
        uVar8 = puVar2[uVar6] * uVar7;
        if (uVar8 < uVar7) {
          this->_m_jointIndicesValid = false;
        }
        uVar7 = uVar8;
      }
      this->_m_nrJointActions = uVar7;
      pmVar5 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                *)operator_new(0x30);
      p_Var1 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined8 *)&(pmVar5->_M_t)._M_impl = 0;
      *(undefined8 *)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      this->_m_jointActionIndices = pmVar5;
    }
    else {
      this->_m_nrJointActions =
           (long)(this->_m_jointActionVec).
                 super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_m_jointActionVec).
                 super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
    }
  }
  this->_m_initialized = b;
  return true;
}

Assistant:

bool MADPComponentDiscreteActions::SetInitialized(bool b)
{
    if(b == false)
    {
        if(_m_initialized == true)
            delete [] _m_actionStepSize;
        _m_initialized = b;
        return true;
    }
    if(_m_initialized == true && b == true)
    {
        //first free mem before re-initialize:
        delete [] _m_actionStepSize;
    }
    if(b == true)
    {
        _m_actionStepSize=IndexTools::CalculateStepSize(_m_nrActions);

        if(!_m_cachedAllJointActions)
        {
            size_t nrJA=1;
            size_t prevNrJA=nrJA;
            for(Index i=0;i!=_m_nrActions.size();++i)
            {
                nrJA*=_m_nrActions[i];
                // detect overflow
                if(nrJA<prevNrJA)
                    _m_jointIndicesValid=false;
                prevNrJA=nrJA;
            }
            _m_nrJointActions=nrJA;
            _m_jointActionIndices=
                new map<Index, vector<Index> *>();
        }
        else
            _m_nrJointActions=_m_jointActionVec.size();
        _m_initialized = b;
    }
    return(true);
}